

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O3

FT_Bool tt_check_single_notdef(FT_Face ttface)

{
  FT_ListNode pFVar1;
  ulong uVar2;
  FT_Error FVar3;
  ulong uVar4;
  FT_ListNode pFVar5;
  FT_ListNode pFVar6;
  FT_ListNode pFVar7;
  bool bVar8;
  FT_UInt asize;
  char buf [8];
  FT_UInt local_4c;
  char local_48;
  undefined7 uStack_47;
  FT_ListNode local_40;
  ulong local_38;
  
  pFVar1 = ttface[4].sizes_list.tail;
  if (pFVar1 == (FT_ListNode)0x0) {
LAB_00173a91:
    bVar8 = false;
  }
  else {
    local_40 = (FT_ListNode)((long)&pFVar1[-1].data + 7);
    bVar8 = true;
    uVar4 = 0;
    pFVar6 = (FT_ListNode)0x0;
    uVar2 = uVar4;
    pFVar5 = (FT_ListNode)0x0;
    do {
      while (local_38 = uVar2, pFVar7 = pFVar6,
            tt_face_get_location((TT_Face)ttface,(FT_UInt)pFVar7,&local_4c), local_4c == 0) {
        pFVar6 = (FT_ListNode)((long)&pFVar7->prev + 1);
        uVar2 = local_38;
        if (pFVar1 == pFVar6) {
          pFVar7 = pFVar5;
          if ((local_38 & 1) == 0) goto LAB_00173a91;
          goto LAB_00173a54;
        }
      }
      if (!bVar8) goto LAB_00173a91;
      uVar4 = CONCAT71((int7)(uVar4 >> 8),1);
      bVar8 = false;
      pFVar6 = (FT_ListNode)((long)&pFVar7->prev + 1);
      uVar2 = uVar4;
      pFVar5 = pFVar7;
    } while (local_40 != pFVar7);
LAB_00173a54:
    if (pFVar7 == (FT_ListNode)0x0) {
      bVar8 = true;
    }
    else {
      FVar3 = FT_Get_Glyph_Name(ttface,(FT_UInt)pFVar7,&local_48,8);
      bVar8 = false;
      if ((FVar3 == 0) && (local_48 == '.')) {
        bVar8 = CONCAT71(uStack_47,0x2e) == 0x666564746f6e2e;
      }
    }
  }
  return bVar8;
}

Assistant:

static FT_Bool
  tt_check_single_notdef( FT_Face  ttface )
  {
    FT_Bool   result = FALSE;

    TT_Face   face = (TT_Face)ttface;
    FT_UInt   asize;
    FT_ULong  i;
    FT_ULong  glyph_index = 0;
    FT_UInt   count       = 0;


    for( i = 0; i < face->num_locations; i++ )
    {
      tt_face_get_location( face, i, &asize );
      if ( asize > 0 )
      {
        count += 1;
        if ( count > 1 )
          break;
        glyph_index = i;
      }
    }

    /* Only have a single outline. */
    if ( count == 1 )
    {
      if ( glyph_index == 0 )
        result = TRUE;
      else
      {
        /* FIXME: Need to test glyphname == .notdef ? */
        FT_Error error;
        char buf[8];


        error = FT_Get_Glyph_Name( ttface, glyph_index, buf, 8 );
        if ( !error                                            &&
             buf[0] == '.' && !ft_strncmp( buf, ".notdef", 8 ) )
          result = TRUE;
      }
    }

    return result;
  }